

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O3

int Abc_CommandAbc9Scl(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  Gia_Man_t *pGVar2;
  char *pcVar3;
  uint fVerbEquivs;
  uint fEquiv;
  char *pcVar4;
  uint fConst;
  uint local_3c;
  
  local_3c = 0;
  Extra_UtilGetoptReset();
  fConst = 1;
  fEquiv = 1;
  fVerbEquivs = 0;
  while( true ) {
    while( true ) {
      while( true ) {
        while (iVar1 = Extra_UtilGetopt(argc,argv,"cevwh"), iVar1 == 0x77) {
          fVerbEquivs = fVerbEquivs ^ 1;
        }
        if (100 < iVar1) break;
        if (iVar1 == -1) {
          if (pAbc->pGia != (Gia_Man_t *)0x0) {
            iVar1 = Gia_ManBoxNum(pAbc->pGia);
            if ((iVar1 == 0) || (iVar1 = Gia_ManRegBoxNum(pAbc->pGia), iVar1 == 0)) {
              if (pAbc->pGia->nRegs == 0) {
                Abc_Print(-1,"The network is combinational.\n");
                return 0;
              }
              pGVar2 = Gia_ManSeqStructSweep(pAbc->pGia,fConst,fEquiv,local_3c);
              Abc_FrameUpdateGia(pAbc,pGVar2);
            }
            else {
              if (pAbc->pGia->pAigExtra != (Gia_Man_t *)0x0) {
                pGVar2 = Gia_ManSweepWithBoxes
                                   (pAbc->pGia,(void *)0x0,(void *)0x0,fConst,fEquiv,local_3c,
                                    fVerbEquivs);
                Abc_FrameUpdateGia(pAbc,pGVar2);
                return 0;
              }
              puts("Timing manager is given but there is no GIA of boxes.");
            }
            return 0;
          }
          pcVar3 = "Abc_CommandAbc9Scl(): There is no AIG.\n";
          iVar1 = -1;
          goto LAB_0027ec50;
        }
        if (iVar1 != 99) goto LAB_0027eaf5;
        fConst = fConst ^ 1;
      }
      if (iVar1 != 0x65) break;
      fEquiv = fEquiv ^ 1;
    }
    if (iVar1 != 0x76) break;
    local_3c = local_3c ^ 1;
  }
LAB_0027eaf5:
  Abc_Print(-2,"usage: &scl [-cevwh]\n");
  Abc_Print(-2,"\t         performs structural sequential cleanup\n");
  pcVar4 = "yes";
  pcVar3 = "yes";
  if (fConst == 0) {
    pcVar3 = "no";
  }
  Abc_Print(-2,"\t-c     : toggle removing stuck-at constant registers [default = %s]\n",pcVar3);
  pcVar3 = "yes";
  if (fEquiv == 0) {
    pcVar3 = "no";
  }
  Abc_Print(-2,"\t-e     : toggle removing equivalent-driver registers [default = %s]\n",pcVar3);
  pcVar3 = "yes";
  if (local_3c == 0) {
    pcVar3 = "no";
  }
  Abc_Print(-2,"\t-v     : toggle printing verbose information [default = %s]\n",pcVar3);
  if (fVerbEquivs == 0) {
    pcVar4 = "no";
  }
  Abc_Print(-2,"\t-w     : toggle printing verbose info about equivalent flops [default = %s]\n",
            pcVar4);
  pcVar3 = "\t-h     : print the command usage\n";
  iVar1 = -2;
LAB_0027ec50:
  Abc_Print(iVar1,pcVar3);
  return 1;
}

Assistant:

int Abc_CommandAbc9Scl( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Gia_Man_t * pTemp;
    int c;
    int fConst = 1;
    int fEquiv = 1;
    int fVerbose = 0;
    int fVerboseFlops = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "cevwh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'c':
            fConst ^= 1;
            break;
        case 'e':
            fEquiv ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'w':
            fVerboseFlops ^= 1;
            break;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9Scl(): There is no AIG.\n" );
        return 1;
    }
    if ( Gia_ManBoxNum(pAbc->pGia) && Gia_ManRegBoxNum(pAbc->pGia) )
    {
        if ( pAbc->pGia->pAigExtra == NULL )
        {
            printf( "Timing manager is given but there is no GIA of boxes.\n" );
            return 0;
        }
        pTemp = Gia_ManSweepWithBoxes( pAbc->pGia, NULL, NULL, fConst, fEquiv, fVerbose, fVerboseFlops );
        Abc_FrameUpdateGia( pAbc, pTemp );
        return 0;
    }
    if ( Gia_ManRegNum(pAbc->pGia) == 0 )
    {
        Abc_Print( -1, "The network is combinational.\n" );
        return 0;
    }
    pTemp = Gia_ManSeqStructSweep( pAbc->pGia, fConst, fEquiv, fVerbose );
    Abc_FrameUpdateGia( pAbc, pTemp );
    return 0;

usage:
    Abc_Print( -2, "usage: &scl [-cevwh]\n" );
    Abc_Print( -2, "\t         performs structural sequential cleanup\n" );
    Abc_Print( -2, "\t-c     : toggle removing stuck-at constant registers [default = %s]\n", fConst? "yes": "no" );
    Abc_Print( -2, "\t-e     : toggle removing equivalent-driver registers [default = %s]\n", fEquiv? "yes": "no" );
    Abc_Print( -2, "\t-v     : toggle printing verbose information [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-w     : toggle printing verbose info about equivalent flops [default = %s]\n", fVerboseFlops? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}